

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O1

void update_loff(hts_idx_t *idx,int i,int free_lidx)

{
  khint_t kVar1;
  bidx_t *pbVar2;
  khint32_t *pkVar3;
  byte bVar4;
  ulong uVar5;
  uint64_t uVar6;
  lidx_t *plVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint64_t *puVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  char cVar16;
  char cVar17;
  
  pbVar2 = idx->bidx[i];
  plVar7 = idx->lidx + i;
  if (pbVar2 == (bidx_t *)0x0) {
    uVar13 = 1;
  }
  else {
    kVar1 = pbVar2->n_buckets;
    if (kVar1 == 0) {
      uVar15 = 0;
    }
    else {
      uVar12 = idx->n_bins + 1;
      uVar14 = kVar1 - 1 & uVar12;
      iVar8 = 1;
      uVar10 = uVar14;
      do {
        bVar4 = (char)uVar10 * '\x02' & 0x1e;
        uVar15 = pbVar2->flags[uVar10 >> 4] >> bVar4;
        if (((uVar15 & 2) != 0) || (((uVar15 & 1) == 0 && (pbVar2->keys[uVar10] == uVar12)))) {
          uVar15 = uVar10;
          if ((pbVar2->flags[uVar10 >> 4] >> bVar4 & 3) != 0) {
            uVar15 = kVar1;
          }
          break;
        }
        uVar10 = uVar10 + iVar8 & kVar1 - 1;
        iVar8 = iVar8 + 1;
        uVar15 = kVar1;
      } while (uVar10 != uVar14);
    }
    if (uVar15 == kVar1) {
      uVar6 = 0;
    }
    else {
      uVar6 = (pbVar2->vals[uVar15].list)->u;
    }
    uVar15 = plVar7->n;
    uVar13 = 0;
    if (0 < (int)uVar15) {
      puVar11 = plVar7->offset;
      uVar5 = 0;
      do {
        uVar13 = uVar5;
        if (puVar11[uVar5] != 0xffffffffffffffff) break;
        puVar11[uVar5] = uVar6;
        uVar5 = uVar5 + 1;
        uVar13 = (ulong)uVar15;
      } while (uVar15 != uVar5);
    }
  }
  iVar8 = plVar7->n;
  if ((int)uVar13 < iVar8) {
    puVar11 = plVar7->offset + (uVar13 & 0xffffffff);
    do {
      if (*puVar11 == 0xffffffffffffffff) {
        *puVar11 = puVar11[-1];
      }
      puVar11 = puVar11 + 1;
      uVar15 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar15;
    } while ((int)uVar15 < iVar8);
  }
  if (pbVar2 != (bidx_t *)0x0) {
    uVar15 = pbVar2->n_buckets;
    if ((ulong)uVar15 != 0) {
      pkVar3 = pbVar2->flags;
      uVar13 = 0;
      do {
        if ((pkVar3[uVar13 >> 4 & 0xfffffff] >> ((char)uVar13 * '\x02' & 0x1fU) & 3) == 0) {
          uVar10 = pbVar2->keys[uVar13];
          if (uVar10 < (uint)idx->n_bins) {
            cVar17 = '\0';
            cVar16 = '\0';
            uVar12 = uVar10;
            if (uVar10 != 0) {
              do {
                cVar16 = cVar17 + '\x01';
                uVar14 = uVar12 - 1;
                uVar12 = (int)uVar14 >> 3;
                cVar17 = cVar16;
              } while (7 < uVar14);
            }
            iVar9 = uVar10 - (uint)((ulong)(uint)~(-1 << (cVar16 * '\x03' & 0x1fU)) * 0x92492493 >>
                                   0x22) << (((char)idx->n_lvls - cVar16) * '\x03' & 0x1fU);
            if (iVar8 <= iVar9) goto LAB_0010e3c7;
            uVar6 = plVar7->offset[iVar9];
          }
          else {
LAB_0010e3c7:
            uVar6 = 0;
          }
          pbVar2->vals[uVar13].loff = uVar6;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 != uVar15);
    }
    if (free_lidx != 0) {
      free(plVar7->offset);
      plVar7->n = 0;
      plVar7->m = 0;
      plVar7->offset = (uint64_t *)0x0;
    }
  }
  return;
}

Assistant:

static void update_loff(hts_idx_t *idx, int i, int free_lidx)
{
    bidx_t *bidx = idx->bidx[i];
    lidx_t *lidx = &idx->lidx[i];
    khint_t k;
    int l;
    uint64_t offset0 = 0;
    if (bidx) {
        k = kh_get(bin, bidx, META_BIN(idx));
        if (k != kh_end(bidx))
            offset0 = kh_val(bidx, k).list[0].u;
        for (l = 0; l < lidx->n && lidx->offset[l] == (uint64_t)-1; ++l)
            lidx->offset[l] = offset0;
    } else l = 1;
    for (; l < lidx->n; ++l) // fill missing values
        if (lidx->offset[l] == (uint64_t)-1)
            lidx->offset[l] = lidx->offset[l-1];
    if (bidx == 0) return;
    for (k = kh_begin(bidx); k != kh_end(bidx); ++k) // set loff
        if (kh_exist(bidx, k))
        {
            if ( kh_key(bidx, k) < idx->n_bins )
            {
                int bot_bin = hts_bin_bot(kh_key(bidx, k), idx->n_lvls);
                // disable linear index if bot_bin out of bounds
                kh_val(bidx, k).loff = bot_bin < lidx->n ? lidx->offset[bot_bin] : 0;
            }
            else
                kh_val(bidx, k).loff = 0;
        }
    if (free_lidx) {
        free(lidx->offset);
        lidx->m = lidx->n = 0;
        lidx->offset = 0;
    }
}